

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

mbedtls_cipher_info_t * mbedtls_cipher_info_from_string(char *cipher_name)

{
  int iVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t **ppmVar3;
  
  if (cipher_name != (char *)0x0) {
    pmVar2 = &aes_128_ecb_info;
    ppmVar3 = &mbedtls_cipher_definitions[1].info;
    do {
      iVar1 = strcmp(pmVar2->name,cipher_name);
      if (iVar1 == 0) {
        return pmVar2;
      }
      pmVar2 = *ppmVar3;
      ppmVar3 = ppmVar3 + 2;
    } while (pmVar2 != (mbedtls_cipher_info_t *)0x0);
  }
  return (mbedtls_cipher_info_t *)0x0;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_string( const char *cipher_name )
{
    const mbedtls_cipher_definition_t *def;

    if( NULL == cipher_name )
        return( NULL );

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( !  strcmp( def->info->name, cipher_name ) )
            return( def->info );

    return( NULL );
}